

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVE.cpp
# Opt level: O0

void __thiscall OpenMD::NVE::moveA(NVE *this)

{
  bool bVar1;
  StuntDouble *in_RDI;
  RealType mass;
  Vector3d ji;
  Vector3d Tb;
  Vector3d frc;
  Vector3d pos;
  Vector3d vel;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  Vector<double,_3U> *in_stack_fffffffffffffe68;
  StuntDouble *in_stack_fffffffffffffe70;
  StuntDouble *in_stack_fffffffffffffe80;
  iterator *in_stack_fffffffffffffe88;
  SimInfo *in_stack_fffffffffffffe90;
  Vector3d *in_stack_fffffffffffffef0;
  StuntDouble *in_stack_fffffffffffffef8;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x298483);
  Vector3<double>::Vector3((Vector3<double> *)0x298490);
  Vector3<double>::Vector3((Vector3<double> *)0x29849d);
  Vector3<double>::Vector3((Vector3<double> *)0x2984aa);
  Vector3<double>::Vector3((Vector3<double> *)0x2984b7);
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffe90,(MoleculeIterator *)in_stack_fffffffffffffe88);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe70,
                 (Vector3<double> *)in_stack_fffffffffffffe68);
      StuntDouble::getPos(in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe70,
                 (Vector3<double> *)in_stack_fffffffffffffe68);
      StuntDouble::getFrc(in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe70,
                 (Vector3<double> *)in_stack_fffffffffffffe68);
      StuntDouble::getMass(local_28);
      OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe70);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe70);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      StuntDouble::setVel(in_stack_fffffffffffffe80,(Vector3d *)in_RDI);
      StuntDouble::setPos(in_stack_fffffffffffffe80,(Vector3d *)in_RDI);
      bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffe70);
      if (bVar1) {
        StuntDouble::getTrq(in_RDI);
        StuntDouble::lab2Body(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        Vector3<double>::operator=
                  ((Vector3<double> *)local_28,(Vector3<double> *)in_stack_fffffffffffffe68);
        StuntDouble::getJ(in_RDI);
        Vector3<double>::operator=
                  ((Vector3<double> *)local_28,(Vector3<double> *)in_stack_fffffffffffffe68);
        OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)local_28);
        Vector<double,_3U>::operator+=((Vector<double,_3U> *)local_28,in_stack_fffffffffffffe68);
        RotationAlgorithm::rotate
                  ((RotationAlgorithm *)in_stack_fffffffffffffe80,in_RDI,(Vector3d *)local_28,
                   (RealType)in_stack_fffffffffffffe68);
        StuntDouble::setJ(in_stack_fffffffffffffe80,(Vector3d *)in_RDI);
        in_stack_fffffffffffffe70 = local_28;
      }
      local_28 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    local_20 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffe90,(MoleculeIterator *)in_stack_fffffffffffffe88);
  }
  (*(in_RDI[1].snapshotMan_)->_vptr_SnapshotManager[4])();
  Rattle::constraintA((Rattle *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void NVE::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        pos  = sd->getPos();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        // position whole step
        pos += dt * vel;

        sd->setVel(vel);
        sd->setPos(pos);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    flucQ_->moveA();
    rattle_->constraintA();
  }